

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildUpperSAH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *treeletRoots,
          int start,int end,atomic<int> *totalNodes)

{
  anon_class_32_3_6c4e2daa __pred;
  Point3<float> p;
  int iVar1;
  reference ppBVar2;
  float *pfVar3;
  char (*args_2) [4];
  BVHBuildNode **ppBVar4;
  BVHBuildNode *this_00;
  int in_ECX;
  long lVar5;
  BVHAggregate *in_RDX;
  memory_resource *in_RDI;
  int in_R8D;
  __atomic_base<int> *in_R9;
  float fVar6;
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  Point3<float> PVar10;
  int vb_5;
  int va_5;
  int vb_4;
  int va_4;
  int mid;
  BVHBuildNode **pmid;
  int i_4;
  int minCostSplitBucket;
  Float minCost;
  int j_1;
  int j;
  int count1;
  int count0;
  Bounds3f b1;
  Bounds3f b0;
  int i_3;
  Float cost [11];
  int vb_3;
  int va_3;
  int vb_2;
  int va_2;
  int b;
  Float centroid_1;
  int i_2;
  BVHSplitBucket buckets [12];
  int nBuckets;
  float vb_1;
  float va_1;
  int dim;
  Point3f centroid;
  int i_1;
  Bounds3f centroidBounds;
  int i;
  Bounds3f bounds;
  BVHBuildNode *node;
  int nNodes;
  int vb;
  int va;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffba0;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffba8;
  Bounds3<float> *in_stack_fffffffffffffbb0;
  BVHBuildNode *in_stack_fffffffffffffbb8;
  Bounds3<float> *in_stack_fffffffffffffbc0;
  value_type pBVar11;
  float in_stack_fffffffffffffbc8;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  float in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf4;
  char *in_stack_fffffffffffffbf8;
  float in_stack_fffffffffffffc00;
  float in_stack_fffffffffffffc04;
  float in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  undefined4 uVar12;
  LogLevel in_stack_fffffffffffffc14;
  LogLevel level;
  char (*pacVar13) [4];
  char (*in_stack_fffffffffffffc20) [25];
  value_type in_stack_fffffffffffffc28;
  float *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  float in_stack_fffffffffffffc80;
  int local_378;
  float local_370;
  int local_354;
  int local_338;
  int local_334;
  int local_330;
  int local_2fc;
  float local_2f8 [11];
  undefined8 local_2cc;
  undefined8 local_2c4;
  undefined8 local_2bc;
  undefined4 local_2b4;
  int local_2b0;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  float local_2a0;
  int local_29c;
  int local_298;
  char acStack_294 [8];
  undefined8 auStack_28c [40];
  char local_148 [4];
  float local_144;
  float local_140;
  int local_13c;
  undefined8 local_138;
  float local_130;
  undefined8 local_128;
  float local_120;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  int local_a0;
  Tuple3<pbrt::Point3,_float> local_9c;
  Tuple3<pbrt::Point3,_float> aTStack_90 [3];
  int local_6c;
  value_type local_50;
  int local_44;
  int iVar14;
  int iVar15;
  Allocator alloc_00;
  value_type local_10;
  undefined1 auVar7 [64];
  
  if (in_R8D <= in_ECX) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (in_stack_fffffffffffffc14,
               (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (int)in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
               (char (*) [6])CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (char (*) [4])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               (char (*) [6])in_stack_fffffffffffffc20,(int *)in_stack_fffffffffffffc28,
               (char (*) [4])in_RDI,(int *)in_stack_fffffffffffffc38);
  }
  local_44 = in_R8D - in_ECX;
  if (local_44 == 1) {
    ppBVar2 = std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                        ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                         in_RDX,(long)in_ECX);
    local_10 = *ppBVar2;
  }
  else {
    iVar14 = in_R8D;
    iVar15 = in_ECX;
    alloc_00.memoryResource = in_RDI;
    std::__atomic_base<int>::operator++(in_R9,0);
    local_50 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::BVHBuildNode>
                         (in_stack_fffffffffffffba0);
    local_6c = iVar15;
    Bounds3<float>::Bounds3(in_stack_fffffffffffffbc0);
    local_a0 = local_6c;
    for (; local_6c < iVar14; local_6c = local_6c + 1) {
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)in_RDX,
                 (long)local_6c);
      Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    }
    Bounds3<float>::Bounds3(in_stack_fffffffffffffbc0);
    iVar15 = local_a0;
    for (; local_a0 < iVar14; local_a0 = local_a0 + 1) {
      ppBVar2 = std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                          ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                           in_RDX,(long)local_a0);
      in_stack_fffffffffffffc28 = *ppBVar2;
      ppBVar2 = std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                          ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                           in_RDX,(long)local_a0);
      pBVar11 = *ppBVar2;
      local_d8 = (pBVar11->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
      local_e0._0_4_ = (pBVar11->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      local_e0._4_4_ = (pBVar11->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar9 = ZEXT856(0);
      PVar10.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffbc8;
      PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffbc0;
      local_d0 = local_e0;
      local_c8 = local_d8;
      PVar10 = Tuple3<pbrt::Point3,float>::operator+(in_stack_fffffffffffffba8,PVar10);
      local_e8 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
      auVar7._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar9;
      local_f0 = vmovlpd_avx(auVar7._0_16_);
      auVar9 = (undefined1  [56])0x0;
      local_c0 = local_f0;
      local_b8 = local_e8;
      PVar10 = Tuple3<pbrt::Point3,float>::operator*
                         ((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffbb0,
                          (float)((ulong)in_stack_fffffffffffffba8 >> 0x20));
      local_130 = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
      auVar8._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar8._8_56_ = auVar9;
      local_138 = vmovlpd_avx(auVar8._0_16_);
      p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffc7c;
      p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffc78;
      p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc80;
      local_128 = local_138;
      local_120 = local_130;
      local_100 = local_138;
      local_f8 = local_130;
      local_b0 = local_138;
      local_a8 = local_130;
      Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),p
                  );
    }
    local_13c = Bounds3<float>::MaxDimension(&in_stack_fffffffffffffbb8->bounds);
    pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](aTStack_90,local_13c);
    local_140 = *pfVar3;
    pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](&local_9c,local_13c);
    local_144 = *pfVar3;
    if ((local_140 == local_144) && (!NAN(local_140) && !NAN(local_144))) {
      LogFatal<char_const(&)[25],char_const(&)[25],char_const(&)[25],float&,char_const(&)[25],float&>
                (in_stack_fffffffffffffc14,
                 (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (int)in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                 (char (*) [25])CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (char (*) [25])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 in_stack_fffffffffffffc20,(float *)in_stack_fffffffffffffc28,(char (*) [25])in_RDI,
                 in_stack_fffffffffffffc38);
    }
    local_148[0] = '\f';
    local_148[1] = '\0';
    local_148[2] = '\0';
    local_148[3] = '\0';
    args_2 = (char (*) [4])&local_298;
    pacVar13 = &local_148;
    local_29c = iVar15;
    do {
      uVar12 = SUB84(args_2,0);
      level = (LogLevel)((ulong)args_2 >> 0x20);
      buildUpperSAH::BVHSplitBucket::BVHSplitBucket((BVHSplitBucket *)0x8f4eb9);
      args_2 = (char (*) [4])(CONCAT44(level,uVar12) + 0x1c);
      iVar15 = local_29c;
    } while (args_2 != pacVar13);
    for (; local_29c < iVar14; local_29c = local_29c + 1) {
      ppBVar2 = std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                          ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                           in_RDX,(long)local_29c);
      pfVar3 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)*ppBVar2,local_13c);
      in_stack_fffffffffffffc00 = *pfVar3;
      ppBVar2 = std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                          ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                           in_RDX,(long)local_29c);
      pfVar3 = Tuple3<pbrt::Point3,_float>::operator[]
                         (&((*ppBVar2)->bounds).pMax.super_Tuple3<pbrt::Point3,_float>,local_13c);
      in_stack_fffffffffffffc04 = (in_stack_fffffffffffffc00 + *pfVar3) * 0.5;
      local_2a0 = in_stack_fffffffffffffc04;
      pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](&local_9c,local_13c);
      in_stack_fffffffffffffc0c = in_stack_fffffffffffffc04 - *pfVar3;
      pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](aTStack_90,local_13c);
      in_stack_fffffffffffffc08 = *pfVar3;
      pfVar3 = Tuple3<pbrt::Point3,_float>::operator[](&local_9c,local_13c);
      local_2a4 = (int)((in_stack_fffffffffffffc0c / (in_stack_fffffffffffffc08 - *pfVar3)) * 12.0);
      if (local_2a4 == 0xc) {
        local_2a4 = 0xb;
      }
      local_2a8 = local_2a4;
      local_2ac = 0;
      if (local_2a4 < 0) {
        LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                  (level,(char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (int)in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                   (char (*) [2])CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (char (*) [2])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (char (*) [2])args_2,(int *)in_stack_fffffffffffffc28,(char (*) [2])in_RDI,
                   (int *)in_stack_fffffffffffffc38);
      }
      local_2b0 = local_2a4;
      local_2b4 = 0xc;
      if (0xb < local_2a4) {
        LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                  (level,(char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (int)in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                   (char (*) [2])CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (char (*) [9])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (char (*) [2])args_2,(int *)in_stack_fffffffffffffc28,(char (*) [9])in_RDI,
                   (int *)in_stack_fffffffffffffc38);
      }
      (&local_298)[(long)local_2a4 * 7] = (&local_298)[(long)local_2a4 * 7] + 1;
      in_stack_fffffffffffffbf8 = acStack_294 + (long)local_2a4 * 0x1c;
      std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)in_RDX,
                 (long)local_29c);
      Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                   (Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      lVar5 = (long)local_2a4 * 0x1c;
      *(undefined8 *)(acStack_294 + lVar5) = local_2cc;
      *(undefined8 *)((long)auStack_28c + lVar5) = local_2c4;
      *(undefined8 *)((long)auStack_28c + lVar5 + 8) = local_2bc;
    }
    for (local_2fc = 0; local_2fc < 0xb; local_2fc = local_2fc + 1) {
      Bounds3<float>::Bounds3(in_stack_fffffffffffffbc0);
      Bounds3<float>::Bounds3(in_stack_fffffffffffffbc0);
      local_330 = 0;
      local_334 = 0;
      for (local_338 = 0; local_354 = local_2fc, local_338 <= local_2fc; local_338 = local_338 + 1)
      {
        Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                     ,(Bounds3<float> *)
                      CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_330 = (&local_298)[(long)local_338 * 7] + local_330;
      }
      while (local_354 = local_354 + 1, local_354 < 0xc) {
        Union<float>((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                     ,(Bounds3<float> *)
                      CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        local_334 = (&local_298)[(long)local_354 * 7] + local_334;
      }
      in_stack_fffffffffffffbe8 = (float)local_330;
      fVar6 = Bounds3<float>::SurfaceArea(in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffbf0 = in_stack_fffffffffffffbe8 * fVar6;
      in_stack_fffffffffffffbec = (float)local_334;
      fVar6 = Bounds3<float>::SurfaceArea(in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffbf4 = in_stack_fffffffffffffbf0 + in_stack_fffffffffffffbec * fVar6;
      fVar6 = Bounds3<float>::SurfaceArea(in_stack_fffffffffffffbb0);
      local_2f8[local_2fc] = in_stack_fffffffffffffbf4 / fVar6 + 0.125;
    }
    local_370 = local_2f8[0];
    for (local_378 = 1; local_378 < 0xb; local_378 = local_378 + 1) {
      if (local_2f8[local_378] < local_370) {
        local_370 = local_2f8[local_378];
      }
    }
    std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
              ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)in_RDX,
               (long)iVar15);
    std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
              ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)in_RDX,
               (long)(iVar14 + -1));
    __pred.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffffc04;
    __pred.dim = (int)in_stack_fffffffffffffc00;
    __pred.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffc08;
    __pred.centroidBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc0c;
    __pred.centroidBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar12;
    __pred.centroidBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)level;
    __pred._24_8_ = pacVar13;
    ppBVar4 = std::
              partition<pbrt::BVHBuildNode**,pbrt::BVHAggregate::buildUpperSAH(pstd::pmr::polymorphic_allocator<std::byte>,std::vector<pbrt::BVHBuildNode*,std::allocator<pbrt::BVHBuildNode*>>&,int,int,std::atomic<int>*)const::__0>
                        ((BVHBuildNode **)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         (BVHBuildNode **)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),__pred);
    ppBVar2 = std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::operator[]
                        ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                         in_RDX,0);
    iVar1 = (int)((long)ppBVar4 - (long)ppBVar2 >> 3);
    if (iVar1 <= iVar15) {
      LogFatal<char_const(&)[4],char_const(&)[6],char_const(&)[4],int&,char_const(&)[6],int&>
                (level,(char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (int)in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                 (char (*) [4])CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (char (*) [6])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),args_2,
                 (int *)in_stack_fffffffffffffc28,(char (*) [6])in_RDI,
                 (int *)in_stack_fffffffffffffc38);
    }
    if (iVar14 <= iVar1) {
      LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],int&,char_const(&)[4],int&>
                (level,(char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (int)in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8,
                 (char (*) [4])CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (char (*) [4])CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),args_2,
                 (int *)in_stack_fffffffffffffc28,(char (*) [4])in_RDI,
                 (int *)in_stack_fffffffffffffc38);
    }
    pBVar11 = local_50;
    iVar1 = local_13c;
    this_00 = buildUpperSAH(in_RDX,alloc_00,
                            (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                            CONCAT44(iVar15,iVar14),(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                            (atomic<int> *)CONCAT44(in_ECX,in_R8D));
    buildUpperSAH(in_RDX,alloc_00,
                  (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                  CONCAT44(iVar15,iVar14),(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                  (atomic<int> *)CONCAT44(in_ECX,in_R8D));
    BVHBuildNode::InitInterior(this_00,iVar1,pBVar11,in_stack_fffffffffffffbb8);
    local_10 = local_50;
  }
  return local_10;
}

Assistant:

BVHBuildNode *BVHAggregate::buildUpperSAH(Allocator alloc,
                                          std::vector<BVHBuildNode *> &treeletRoots,
                                          int start, int end,
                                          std::atomic<int> *totalNodes) const {
    CHECK_LT(start, end);
    int nNodes = end - start;
    if (nNodes == 1)
        return treeletRoots[start];
    (*totalNodes)++;
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();

    // Compute bounds of all nodes under this HLBVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, treeletRoots[i]->bounds);

    // Compute bound of HLBVH node centroids, choose split dimension _dim_
    Bounds3f centroidBounds;
    for (int i = start; i < end; ++i) {
        Point3f centroid =
            (treeletRoots[i]->bounds.pMin + treeletRoots[i]->bounds.pMax) * 0.5f;
        centroidBounds = Union(centroidBounds, centroid);
    }
    int dim = centroidBounds.MaxDimension();
    // FIXME: if this hits, what do we need to do?
    // Make sure the SAH split below does something... ?
    CHECK_NE(centroidBounds.pMax[dim], centroidBounds.pMin[dim]);

    // Allocate _BVHSplitBucket_ for SAH partition buckets
    constexpr int nBuckets = 12;
    struct BVHSplitBucket {
        int count = 0;
        Bounds3f bounds;
    };
    BVHSplitBucket buckets[nBuckets];

    // Initialize _BVHSplitBucket_ for HLBVH SAH partition buckets
    for (int i = start; i < end; ++i) {
        Float centroid =
            (treeletRoots[i]->bounds.pMin[dim] + treeletRoots[i]->bounds.pMax[dim]) *
            0.5f;
        int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                            (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
        if (b == nBuckets)
            b = nBuckets - 1;
        CHECK_GE(b, 0);
        CHECK_LT(b, nBuckets);
        buckets[b].count++;
        buckets[b].bounds = Union(buckets[b].bounds, treeletRoots[i]->bounds);
    }

    // Compute costs for splitting after each bucket
    Float cost[nBuckets - 1];
    for (int i = 0; i < nBuckets - 1; ++i) {
        Bounds3f b0, b1;
        int count0 = 0, count1 = 0;
        for (int j = 0; j <= i; ++j) {
            b0 = Union(b0, buckets[j].bounds);
            count0 += buckets[j].count;
        }
        for (int j = i + 1; j < nBuckets; ++j) {
            b1 = Union(b1, buckets[j].bounds);
            count1 += buckets[j].count;
        }
        cost[i] = .125f + (count0 * b0.SurfaceArea() + count1 * b1.SurfaceArea()) /
                              bounds.SurfaceArea();
    }

    // Find bucket to split at that minimizes SAH metric
    Float minCost = cost[0];
    int minCostSplitBucket = 0;
    for (int i = 1; i < nBuckets - 1; ++i) {
        if (cost[i] < minCost) {
            minCost = cost[i];
            minCostSplitBucket = i;
        }
    }

    // Split nodes and create interior HLBVH SAH node
    BVHBuildNode **pmid = std::partition(
        &treeletRoots[start], &treeletRoots[end - 1] + 1, [=](const BVHBuildNode *node) {
            Float centroid = (node->bounds.pMin[dim] + node->bounds.pMax[dim]) * 0.5f;
            int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                                (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            return b <= minCostSplitBucket;
        });
    int mid = pmid - &treeletRoots[0];
    CHECK_GT(mid, start);
    CHECK_LT(mid, end);
    node->InitInterior(dim,
                       this->buildUpperSAH(alloc, treeletRoots, start, mid, totalNodes),
                       this->buildUpperSAH(alloc, treeletRoots, mid, end, totalNodes));
    return node;
}